

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O0

size_t segment(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
              size_t *outbuf_left)

{
  size_t sVar1;
  bool bVar2;
  size_t local_70;
  size_t match_len;
  size_t sp_seg_length;
  size_t inbuf_left_start;
  ucs4_t *inbuf_start;
  size_t bound;
  size_t start;
  size_t i;
  size_t *outbuf_left_local;
  ucs4_t **outbuf_local;
  size_t *inbuf_left_local;
  ucs4_t **inbuf_local;
  converter_desc *converter_local;
  
  inbuf_left_start = (size_t)*inbuf;
  sp_seg_length = *inbuf_left;
  inbuf_start = (ucs4_t *)0x0;
  bound = 0;
  start = 0;
  i = (size_t)outbuf_left;
  outbuf_left_local = (size_t *)outbuf;
  outbuf_local = (ucs4_t **)inbuf_left;
  inbuf_left_local = (size_t *)inbuf;
  inbuf_local = (ucs4_t **)converter;
  do {
    bVar2 = false;
    if ((*(int *)(inbuf_left_start + start * 4) != 0) &&
       (bVar2 = false, *outbuf_local != (ucs4_t *)0x0)) {
      bVar2 = *(long *)i != 0;
    }
    if (!bVar2) {
      if ((*outbuf_local != (ucs4_t *)0x0) && (*(long *)i != 0)) {
        sVar1 = sp_seg((converter_desc *)inbuf_local,(ucs4_t **)inbuf_left_local,
                       (size_t *)outbuf_local,(ucs4_t **)outbuf_left_local,(size_t *)i,
                       (long)inbuf_start - bound);
        if (sVar1 == 0xffffffffffffffff) {
          return 0xffffffffffffffff;
        }
        if (sVar1 == 0) {
          if ((ucs4_t *)sp_seg_length != *outbuf_local) {
            return sp_seg_length - (long)*outbuf_local;
          }
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
      }
      if (*(int *)(inbuf_local + 8) == 1) {
        *outbuf_left_local = *outbuf_left_local - 4;
        *(long *)i = *(long *)i + 1;
      }
      return sp_seg_length - (long)*outbuf_local;
    }
    if ((start != 0) && ((ucs4_t *)start == inbuf_start)) {
      match_len = sp_seg((converter_desc *)inbuf_local,(ucs4_t **)inbuf_left_local,
                         (size_t *)outbuf_local,(ucs4_t **)outbuf_left_local,(size_t *)i,
                         (long)inbuf_start - bound);
      if (match_len == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if (match_len == 0) {
        if ((ucs4_t *)sp_seg_length != *outbuf_local) {
          return sp_seg_length - (long)*outbuf_local;
        }
        errnum = CONVERTER_ERROR_OUTBUF;
        return 0xffffffffffffffff;
      }
      bound = start;
    }
    dictionary_group_match_longest
              (inbuf_local[7],(ucs4_t *)(inbuf_left_start + start * 4),0,&local_70);
    if (local_70 == 0) {
      local_70 = 1;
    }
    if (inbuf_start < (ucs4_t *)(start + local_70)) {
      inbuf_start = (ucs4_t *)(start + local_70);
    }
    start = start + 1;
  } while( true );
}

Assistant:

static size_t segment(converter_desc * converter,
		ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left)
{
	/* 歧義分割最短路徑分詞 */
	size_t i, start, bound;
	const ucs4_t * inbuf_start = *inbuf;
	size_t inbuf_left_start = *inbuf_left;
	size_t sp_seg_length;
	
	bound = 0;
	
	for (i = start = 0; inbuf_start[i] && *inbuf_left > 0 && *outbuf_left > 0; i ++)
	{
		if (i != 0 && i == bound)
		{
			/* 對歧義部分進行最短路徑分詞 */
			sp_seg_length = sp_seg(converter, inbuf, inbuf_left, outbuf, outbuf_left, bound - start);
			if (sp_seg_length ==  (size_t) -1)
				return (size_t) -1;
			if (sp_seg_length == 0)
			{
				if (inbuf_left_start - *inbuf_left > 0)
					return inbuf_left_start - *inbuf_left;
				/* 空間不足 */
				errnum = CONVERTER_ERROR_OUTBUF;
				return (size_t) -1;
			}
			start = i;
		}
	
		size_t match_len;
		dictionary_group_match_longest(
				converter->current_dictionary_group,
				inbuf_start + i,
				0,
				&match_len
		);
		
		if (match_len == 0)
			match_len = 1;
		
		if (i + match_len > bound)
			bound = i + match_len;
	}
	
	if (*inbuf_left > 0 && *outbuf_left > 0)
	{
		sp_seg_length = sp_seg(converter, inbuf, inbuf_left, outbuf, outbuf_left, bound - start);
		if (sp_seg_length ==  (size_t) -1)
			return (size_t) -1;
		if (sp_seg_length == 0)
		{
			if (inbuf_left_start - *inbuf_left > 0)
				return inbuf_left_start - *inbuf_left;
			/* 空間不足 */
			errnum = CONVERTER_ERROR_OUTBUF;
			return (size_t) -1;
		}
	}

	if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
	{
		(*outbuf) --;
		(*outbuf_left) ++;
	}

	return inbuf_left_start - *inbuf_left;
}